

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::i2p_connection::
open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_connection *this,string *hostname,int port,i2p_session_options *session_options,
          _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  size_t __n;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  i2p_session_options *piVar8;
  difference_type extraout_RDX;
  bool bVar9;
  span<char> buffer;
  span<const_char> in;
  char tmp [20];
  undefined1 local_c9;
  undefined1 local_c8 [40];
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *local_a0;
  long *local_98 [2];
  long local_88 [2];
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:509:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_78;
  aux local_48 [24];
  
  __n = (this->m_hostname)._M_string_length;
  piVar8 = session_options;
  if (__n == hostname->_M_string_length) {
    if (__n == 0) {
      bVar9 = true;
    }
    else {
      iVar7 = bcmp((this->m_hostname)._M_dataplus._M_p,(hostname->_M_dataplus)._M_p,__n);
      bVar9 = iVar7 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  if ((((!bVar9) || (this->m_port != port)) ||
      (peVar1 = (this->m_sam_socket).
                super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      peVar1 == (element_type *)0x0)) ||
     (((((implementation_type *)
        ((long)&(peVar1->super_proxy_base).m_sock.
                super_noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                .
                super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        + 8))->super_base_implementation_type).socket_ == -1 && (this->m_state != sam_connecting))))
  {
    ::std::__cxx11::string::_M_assign((string *)&this->m_hostname);
    this->m_port = port;
    if ((this->m_hostname)._M_string_length != 0) {
      this->m_state = sam_connecting;
      buffer.m_len = extraout_RDX;
      buffer.m_ptr = (char *)0x14;
      local_a0 = handler;
      aux::random_bytes(local_48,buffer);
      ::std::__cxx11::string::resize((ulong)&this->m_session_id,'(');
      in.m_len = (difference_type)(this->m_session_id)._M_dataplus._M_p;
      in.m_ptr = (char *)0x14;
      aux::to_hex(local_48,in,(char *)piVar8);
      local_c8._0_8_ = (element_type *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<libtorrent::i2p_stream,std::allocator<libtorrent::i2p_stream>,boost::asio::io_context&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8),
                 (i2p_stream **)local_c8,(allocator<libtorrent::i2p_stream> *)&local_c9,
                 this->m_io_service);
      uVar6 = local_c8._0_8_;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_c8._12_4_,local_c8._8_4_);
      local_c8._0_8_ = (i2p_stream *)0x0;
      local_c8._8_4_ = 0;
      local_c8._12_4_ = 0;
      this_00 = (this->m_sam_socket).
                super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->m_sam_socket).super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar6;
      (this->m_sam_socket).super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_c8._12_4_,local_c8._8_4_)
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_c8._12_4_,local_c8._8_4_));
      }
      peVar1 = (this->m_sam_socket).
               super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar2 = (this->m_hostname)._M_dataplus._M_p;
      local_98[0] = local_88;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar2,pcVar2 + (this->m_hostname)._M_string_length);
      iVar7 = this->m_port;
      ::std::__cxx11::string::operator=
                ((string *)&(peVar1->super_proxy_base).m_hostname,(string *)local_98);
      (peVar1->super_proxy_base).m_port = iVar7;
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      peVar1 = (this->m_sam_socket).
               super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar1->m_command = cmd_create_session;
      peVar1->m_id = (this->m_session_id)._M_dataplus._M_p;
      iVar7 = session_options->m_outbound_quantity;
      iVar4 = session_options->m_inbound_length;
      iVar5 = session_options->m_outbound_length;
      (peVar1->m_session_options).m_inbound_quantity = session_options->m_inbound_quantity;
      (peVar1->m_session_options).m_outbound_quantity = iVar7;
      (peVar1->m_session_options).m_inbound_length = iVar4;
      (peVar1->m_session_options).m_outbound_length = iVar5;
      local_78.m_handler.s.super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (this->m_sam_socket).
               super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c8._8_4_ = 0;
      local_c8._12_4_ = 0;
      local_c8._16_4_ = 0;
      local_c8._20_8_ = 0;
      local_c8._0_8_ = (i2p_stream *)0x2;
      local_78.m_handler.s.super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (this->m_sam_socket).
           super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_78.m_handler.s.
          super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_78.m_handler.s.
           super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_78.m_handler.s.
                super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_78.m_handler.s.
           super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_78.m_handler.s.
                super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_78.m_underlying_handler._M_f = local_a0->_M_f;
      local_78.m_underlying_handler._8_8_ = *(undefined8 *)&local_a0->field_0x8;
      local_78.m_underlying_handler._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
           (local_a0->_M_bound_args).
           super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
           super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
      local_78.m_handler.this = this;
      i2p_stream::
      async_connect<libtorrent::aux::wrap_allocator_t<libtorrent::i2p_connection::open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(std::__cxx11::string_const&,int,libtorrent::i2p_session_options_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
                (local_78.m_handler.s.
                 super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (endpoint_type *)local_c8,&local_78);
      if (local_78.m_handler.s.
          super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.m_handler.s.
                   super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
  }
  return;
}

Assistant:

void open(std::string const& hostname, int port,
		i2p_session_options const& session_options, Handler handler)
	{
		// we already seem to have a session to this SAM router
		if (m_hostname == hostname
			&& m_port == port
			&& m_sam_socket
			&& (is_open() || m_state == sam_connecting)) return;

		m_hostname = hostname;
		m_port = port;

		if (m_hostname.empty()) return;

		m_state = sam_connecting;

		char tmp[20];
		aux::random_bytes(tmp);
		m_session_id.resize(sizeof(tmp)*2);
		aux::to_hex(tmp, &m_session_id[0]);

		m_sam_socket = std::make_shared<i2p_stream>(m_io_service);
		m_sam_socket->set_proxy(m_hostname, m_port);
		m_sam_socket->set_command(i2p_stream::cmd_create_session);
		m_sam_socket->set_session_id(m_session_id.c_str());
		m_sam_socket->set_session_options(session_options);

		ADD_OUTSTANDING_ASYNC("i2p_stream::on_sam_connect");
		m_sam_socket->async_connect(tcp::endpoint(), aux::wrap_allocator(
			[this,s=m_sam_socket](error_code const& ec, Handler hn) {
				on_sam_connect(ec, s, std::move(hn));
			}, std::move(handler)));
	}